

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_size(kvtree *hash)

{
  kvtree_elem_struct *local_20;
  kvtree_elem *elem;
  int count;
  kvtree *hash_local;
  
  elem._4_4_ = 0;
  if (hash != (kvtree *)0x0) {
    for (local_20 = hash->lh_first; local_20 != (kvtree_elem_struct *)0x0;
        local_20 = (local_20->pointers).le_next) {
      elem._4_4_ = elem._4_4_ + 1;
    }
  }
  return elem._4_4_;
}

Assistant:

int kvtree_size(const kvtree* hash)
{
  int count = 0;
  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }
  }
  return count;
}